

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

int64 __thiscall IR::Opnd::GetImmediateValue(Opnd *this,Func *func)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  IntConstOpnd *pIVar4;
  Int64ConstOpnd *pIVar5;
  AddrOpnd *pAVar6;
  ThreadContextInfo *context;
  HelperCallOpnd *opnd;
  undefined4 *puVar7;
  Func *func_local;
  Opnd *this_local;
  
  OVar2 = GetKind(this);
  switch(OVar2) {
  case OpndKindIntConst:
    pIVar4 = AsIntConstOpnd(this);
    this_local = (Opnd *)EncodableOpnd<long>::GetValue(&pIVar4->super_EncodableOpnd<long>);
    break;
  case OpndKindInt64Const:
    pIVar5 = AsInt64ConstOpnd(this);
    this_local = (Opnd *)EncodableOpnd<long>::GetValue(&pIVar5->super_EncodableOpnd<long>);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x1d3,"((0))","Unexpected immediate opnd kind");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
    this_local = (Opnd *)0x0;
    break;
  case OpndKindHelperCall:
    context = Func::GetThreadContextInfo(func);
    opnd = AsHelperCallOpnd(this);
    this_local = (Opnd *)GetMethodAddress(context,opnd);
    break;
  case OpndKindAddr:
    pAVar6 = AsAddrOpnd(this);
    this_local = (Opnd *)pAVar6->m_address;
  }
  return (int64)this_local;
}

Assistant:

int64
Opnd::GetImmediateValue(Func* func)
{
    switch (this->GetKind())
    {
    case OpndKindIntConst:
        return this->AsIntConstOpnd()->GetValue();

    case OpndKindInt64Const:
        return this->AsInt64ConstOpnd()->GetValue();

    case OpndKindAddr:
        return (intptr_t)this->AsAddrOpnd()->m_address;

    case OpndKindHelperCall:
        return (intptr_t)IR::GetMethodAddress(func->GetThreadContextInfo(), this->AsHelperCallOpnd());

    default:
        AssertMsg(UNREACHED, "Unexpected immediate opnd kind");
        return 0;
    }
}